

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O2

void __thiscall mp::SPAdapter::GetRandomVectors(SPAdapter *this,Problem *p)

{
  double dVar1;
  uint uVar2;
  Impl *pIVar3;
  CallExpr random;
  pointer pRVar4;
  int *piVar5;
  UnsupportedError *__return_storage_ptr__;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [12];
  uint local_7c;
  SPAdapter *local_78;
  vector<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_> *local_70;
  Problem *local_68;
  ulong local_60;
  double prob;
  string local_50;
  
  std::vector<int,_std::allocator<int>_>::resize
            (&this->var_orig2core_,
             (long)(int)((ulong)((long)(p->vars_).
                                       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(p->vars_).
                                      super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4));
  uVar7 = (ulong)((long)(p->logical_cons_).
                        super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(p->logical_cons_).
                       super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
  iVar6 = (int)uVar7;
  if (iVar6 != 0) {
    local_70 = &this->rvs_;
    local_68 = p;
    std::vector<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>::resize
              (local_70,(long)iVar6);
    uVar9 = 0;
    local_60 = 0;
    local_78 = this;
    if (0 < iVar6) {
      local_60 = uVar7 & 0xffffffff;
    }
    for (; uVar9 != local_60; uVar9 = uVar9 + 1) {
      pIVar3 = (local_68->logical_cons_).
               super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar9].super_ExprBase.impl_;
      if (pIVar3->kind_ != LAST_RELATIONAL) {
        __return_storage_ptr__ = (UnsupportedError *)__cxa_allocate_exception(0x18);
        MakeUnsupportedError<>(__return_storage_ptr__,(CStringRef)0x15531c);
LAB_0014b894:
        __cxa_throw(__return_storage_ptr__,&UnsupportedError::typeinfo,
                    fmt::SystemError::~SystemError);
      }
      random.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.super_ExprBase.impl_ =
           *(BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41> *)&pIVar3[2].kind_;
      if ((((*(int *)random.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.super_ExprBase.
                     impl_ != 0x29) ||
           (*(Impl **)((long)random.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.
                             super_ExprBase.impl_ + 8) != (this->random_).impl_)) ||
          (**(int **)(pIVar3 + 4) != 1)) ||
         ((dVar1 = *(double *)(*(int **)(pIVar3 + 4) + 2), dVar1 != 0.0 || (NAN(dVar1))))) {
        __return_storage_ptr__ = (UnsupportedError *)__cxa_allocate_exception(0x18);
        MakeUnsupportedError<>(__return_storage_ptr__,(CStringRef)0x15531c);
        goto LAB_0014b894;
      }
      uVar2 = *(uint *)((long)random.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.
                              super_ExprBase.impl_ + 0x10);
      if (uVar2 != 0) {
        pRVar4 = (local_70->
                 super__Vector_base<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar7 = 0;
        if (0 < (int)uVar2) {
          uVar7 = (ulong)uVar2;
        }
        for (uVar8 = 0; this = local_78, uVar7 != uVar8; uVar8 = uVar8 + 1) {
          piVar5 = *(int **)((long)random.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.
                                   super_ExprBase.impl_ + 0x18 + uVar8 * 8);
          if (*piVar5 != 1) {
            uVar7 = uVar8 & 0xffffffff;
            break;
          }
          prob = *(double *)(piVar5 + 2);
          if ((prob < 0.0) || (1.0 < prob)) {
            auVar10 = __cxa_allocate_exception(0x18);
            (anonymous_namespace)::lcon_name_abi_cxx11_
                      (&local_50,(_anonymous_namespace_ *)(uVar9 & 0xffffffff),auVar10._8_4_);
            Error::Error<std::__cxx11::string,double>
                      (auVar10._0_8_,(CStringRef)0x15cb87,&local_50,&prob);
            __cxa_throw(auVar10._0_8_,&Error::typeinfo,fmt::SystemError::~SystemError);
          }
          RandomVector::AddProbability(pRVar4 + uVar9,prob);
        }
        local_7c = (uint)uVar7;
        while ((int)uVar7 < (int)uVar2) {
          if (**(int **)((long)random.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.
                               super_ExprBase.impl_ + 0x18 + (long)(int)uVar7 * 8) != 2) {
            auVar10 = __cxa_allocate_exception(0x18);
            (anonymous_namespace)::lcon_name_abi_cxx11_
                      (&local_50,(_anonymous_namespace_ *)(uVar9 & 0xffffffff),auVar10._8_4_);
            Error::Error<std::__cxx11::string>(auVar10._0_8_,(CStringRef)0x15cba2,&local_50);
            __cxa_throw(auVar10._0_8_,&Error::typeinfo,fmt::SystemError::~SystemError);
          }
          GetRealizations(this,(int)uVar9,random,(int *)&local_7c);
          uVar7 = (ulong)local_7c;
        }
      }
    }
  }
  return;
}

Assistant:

void SPAdapter::GetRandomVectors(const Problem &p) {
  var_orig2core_.resize(p.num_vars());
  int num_logical_cons = p.num_logical_cons();
  if (num_logical_cons == 0)
    return;
  rvs_.resize(num_logical_cons);
  for (int con_index = 0; con_index < num_logical_cons; ++con_index) {
    auto expr = p.logical_con(con_index).expr();
    if (expr.kind() != expr::NE)
      throw MakeUnsupportedError("logical constraint");
    auto relational = Cast<RelationalExpr>(expr);
    auto call = Cast<CallExpr>(relational.lhs());
    if (!call || call.function() != random_ || !IsZero(relational.rhs()))
      throw MakeUnsupportedError("logical constraint");
    int num_args = call.num_args();
    if (num_args == 0)
      continue;
    auto &rv = rvs_[con_index];
    int arg_index = 0;
    // Get probabilities.
    for (; arg_index < num_args; ++arg_index) {
      auto constant = Cast<NumericConstant>(call.arg(arg_index));
      if (!constant) break;
      double prob = constant.value();
      if (prob < 0 || prob > 1)
        throw Error("{}: invalid probability {}", lcon_name(con_index), prob);
      rv.AddProbability(prob);
    }
    // Get realizations.
    while (arg_index < num_args) {
      auto arg = call.arg(arg_index);
      if (arg.kind() != expr::VARIABLE)
        throw Error("{}: expected variable or constant", lcon_name(con_index));
      GetRealizations(con_index, call, arg_index);
    }
  }
}